

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O3

HRESULT __thiscall Js::SimpleDataCacheWrapper::ReadHeader(SimpleDataCacheWrapper *this)

{
  HRESULT HVar1;
  HRESULT HVar2;
  DWORD local_20;
  DWORD local_1c;
  DWORD jscriptMajorVersion;
  DWORD jscriptMinorVersion;
  
  HVar1 = AutoSystemInfo::GetJscriptFileVersion(&local_20,&local_1c,(DWORD *)0x0,(DWORD *)0x0);
  if ((((-1 < HVar1) && (HVar1 = -0x7fffbffb, (this->inStream).ptr == (IStream *)0x0)) &&
      (HVar1 = ReadHeader(this), -1 < HVar1)) &&
     (HVar1 = -0x7fffbffb, (this->inStream).ptr == (IStream *)0x0)) {
    HVar2 = ReadHeader(this);
    HVar1 = -0x7fffbffb;
    if (HVar2 < 0) {
      HVar1 = HVar2;
    }
  }
  return HVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::ReadHeader()
    {
        DWORD jscriptMajorVersion;
        DWORD jscriptMinorVersion;
        HRESULT hr = E_FAIL;

        IFFAILRET(AutoSystemInfo::GetJscriptFileVersion(&jscriptMajorVersion, &jscriptMinorVersion));

        DWORD majorVersion;
        IFFAILRET(Read(&majorVersion));
        if (majorVersion != jscriptMajorVersion)
        {
            return E_FAIL;
        }

        DWORD minorVersion;
        IFFAILRET(Read(&minorVersion));
        if (minorVersion != jscriptMinorVersion)
        {
            return E_FAIL;
        }

        return hr;
    }